

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

T_INDEX __thiscall
Nova::Grid<float,_1>::Closest_Cell(Grid<float,_1> *this,TV *location,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  T_INDEX *index;
  
  (this->counts)._data._M_elems[0] =
       (int)((float)(in_ECX + 1) +
            (*(float *)CONCAT44(in_register_00000014,number_of_ghost_cells) -
            location[1]._data._M_elems[0]) * location[4]._data._M_elems[0]) - in_ECX;
  return (T_INDEX)SUB84(this,0);
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}